

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-docs.cpp
# Opt level: O0

void export_md(string *fname,llama_example ex)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  reference pcVar3;
  common_params *in_RDI;
  common_arg *opt;
  iterator __end1;
  iterator __begin1;
  vector<common_arg,_std::allocator<common_arg>_> *__range1;
  vector<common_arg_*,_std::allocator<common_arg_*>_> specific_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> sparam_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> common_options;
  common_params_context ctx_arg;
  common_params params;
  ofstream file;
  _func_void_int_char_ptr_ptr *in_stack_0001b9a8;
  llama_example in_stack_0001b9b4;
  common_params *in_stack_0001b9b8;
  undefined7 in_stack_ffffffffffffe9d8;
  undefined1 in_stack_ffffffffffffe9df;
  reference in_stack_ffffffffffffe9e8;
  reference pcVar4;
  reference in_stack_ffffffffffffe9f0;
  reference in_stack_ffffffffffffe9f8;
  reference in_stack_ffffffffffffea00;
  __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_> local_15f0;
  undefined1 *local_15e8;
  undefined1 auStack_1588 [392];
  common_params *in_stack_ffffffffffffec00;
  ostream local_210 [528];
  
  _Var2 = std::operator|(_S_out,_S_trunc);
  std::ofstream::ofstream(local_210,(string *)in_RDI,_Var2);
  common_params::common_params(in_stack_ffffffffffffec00);
  common_params_parser_init(in_stack_0001b9b8,in_stack_0001b9b4,in_stack_0001b9a8);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x1771d9);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x1771e3);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x1771ed);
  local_15e8 = auStack_1588;
  local_15f0._M_current =
       (common_arg *)
       std::vector<common_arg,_std::allocator<common_arg>_>::begin
                 ((vector<common_arg,_std::allocator<common_arg>_> *)
                  CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8));
  std::vector<common_arg,_std::allocator<common_arg>_>::end
            ((vector<common_arg,_std::allocator<common_arg>_> *)
             CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)in_RDI,
                            (__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8)), bVar1
        ) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
             ::operator*(&local_15f0);
    if ((pcVar3->is_sparam & 1U) == 0) {
      pcVar4 = pcVar3;
      in_stack_ffffffffffffe9df =
           common_arg::in_example
                     (in_stack_ffffffffffffe9f0,
                      (llama_example)((ulong)in_stack_ffffffffffffe9e8 >> 0x20));
      in_stack_ffffffffffffea00 = pcVar4;
      if ((bool)in_stack_ffffffffffffe9df) {
        std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                  ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_RDI,
                   (value_type *)CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8));
      }
      else {
        std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                  ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_RDI,
                   (value_type *)CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8));
        in_stack_ffffffffffffe9e8 = pcVar4;
        pcVar4 = in_stack_ffffffffffffe9f0;
      }
    }
    else {
      in_stack_ffffffffffffea00 = pcVar3;
      std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_RDI,
                 (value_type *)CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8));
      pcVar4 = in_stack_ffffffffffffe9f0;
      in_stack_ffffffffffffe9f8 = pcVar3;
    }
    __gnu_cxx::
    __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>::
    operator++(&local_15f0);
    in_stack_ffffffffffffe9f0 = pcVar4;
  }
  std::operator<<(local_210,"**Common params**\n\n");
  write_table((ofstream *)in_stack_ffffffffffffea00,
              (vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffe9f8);
  std::operator<<(local_210,"\n\n**Sampling params**\n\n");
  write_table((ofstream *)in_stack_ffffffffffffea00,
              (vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffe9f8);
  std::operator<<(local_210,"\n\n**Example-specific params**\n\n");
  write_table((ofstream *)in_stack_ffffffffffffea00,
              (vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffe9f8);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffe9f0);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffe9f0);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffe9f0);
  common_params_context::~common_params_context((common_params_context *)0x177402);
  common_params::~common_params(in_RDI);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

static void export_md(std::string fname, llama_example ex) {
    std::ofstream file(fname, std::ofstream::out | std::ofstream::trunc);

    common_params params;
    auto ctx_arg = common_params_parser_init(params, ex);

    std::vector<common_arg *> common_options;
    std::vector<common_arg *> sparam_options;
    std::vector<common_arg *> specific_options;
    for (auto & opt : ctx_arg.options) {
        // in case multiple LLAMA_EXAMPLE_* are set, we prioritize the LLAMA_EXAMPLE_* matching current example
        if (opt.is_sparam) {
            sparam_options.push_back(&opt);
        } else if (opt.in_example(ctx_arg.ex)) {
            specific_options.push_back(&opt);
        } else {
            common_options.push_back(&opt);
        }
    }

    file << "**Common params**\n\n";
    write_table(file, common_options);
    file << "\n\n**Sampling params**\n\n";
    write_table(file, sparam_options);
    file << "\n\n**Example-specific params**\n\n";
    write_table(file, specific_options);
}